

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

BigInteger * __thiscall rapidjson::internal::BigInteger::operator+=(BigInteger *this,uint64_t u)

{
  ulong local_30;
  size_t i;
  Type backup;
  uint64_t u_local;
  BigInteger *this_local;
  
  i = this->digits_[0];
  this->digits_[0] = u + this->digits_[0];
  local_30 = 0;
  while( true ) {
    if (this->count_ - 1 <= local_30) {
      if (this->digits_[this->count_ - 1] < i) {
        PushBack(this,1);
      }
      return this;
    }
    if (i <= this->digits_[local_30]) break;
    i = this->digits_[local_30 + 1];
    this->digits_[local_30 + 1] = this->digits_[local_30 + 1] + 1;
    local_30 = local_30 + 1;
  }
  return this;
}

Assistant:

BigInteger& operator+=(uint64_t u) {
        Type backup = digits_[0];
        digits_[0] += u;
        for (size_t i = 0; i < count_ - 1; i++) {
            if (digits_[i] >= backup)
                return *this; // no carry
            backup = digits_[i + 1];
            digits_[i + 1] += 1;
        }

        // Last carry
        if (digits_[count_ - 1] < backup)
            PushBack(1);

        return *this;
    }